

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAlgorithms.h
# Opt level: O2

string * cmJoin<cmGraphEdgeList>(string *__return_storage_ptr__,cmGraphEdgeList *r,char *delimiter)

{
  ostream_iterator<cmGraphEdge,_char,_std::char_traits<char>_> *__result;
  ostringstream os;
  undefined1 auStack_1b8 [16];
  ostringstream *local_1a8;
  char *local_1a0;
  ostringstream local_198 [376];
  
  if ((r->super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>).
      super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      (r->super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>).
      super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_198);
    __result = (ostream_iterator<cmGraphEdge,_char,_std::char_traits<char>_> *)
               ((r->super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>).
                super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>._M_impl.
                super__Vector_impl_data._M_finish + -1);
    local_1a8 = local_198;
    local_1a0 = delimiter;
    std::
    copy<__gnu_cxx::__normal_iterator<cmGraphEdge_const*,std::vector<cmGraphEdge,std::allocator<cmGraphEdge>>>,std::ostream_iterator<cmGraphEdge,char,std::char_traits<char>>>
              ((cmGraphEdge *)auStack_1b8,
               (r->super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>).
               super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>._M_impl.
               super__Vector_impl_data._M_start,__result);
    std::ostream::operator<<(local_198,*(int *)&__result->_M_stream);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(local_198);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmJoin(Range const& r, const char* delimiter)
{
  if (r.empty()) {
    return std::string();
  }
  std::ostringstream os;
  typedef typename Range::value_type ValueType;
  typedef typename Range::const_iterator InputIt;
  const InputIt first = r.begin();
  InputIt last = r.end();
  --last;
  std::copy(first, last, std::ostream_iterator<ValueType>(os, delimiter));

  os << *last;

  return os.str();
}